

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

Node * __thiscall
Patch::build_node(Patch *this,Node *left,Node *right,Point old_distance_from_left_ancestor,
                 Point new_distance_from_left_ancestor,Point old_extent,Point new_extent,
                 optional<Text> *old_text,optional<Text> *new_text,uint32_t old_text_size)

{
  Node *pNVar1;
  _Head_base<0UL,_Text_*,_false> _Var2;
  __uniq_ptr_impl<Text,_std::default_delete<Text>_> local_50;
  Node *local_48;
  __uniq_ptr_impl<Text,_std::default_delete<Text>_> local_40;
  Point local_38;
  
  this->change_count = this->change_count + 1;
  local_38 = new_distance_from_left_ancestor;
  local_48 = (Node *)operator_new(0x50);
  if (old_text->is_some == true) {
    _Var2._M_head_impl = (Text *)operator_new(0x38);
    Text::Text(_Var2._M_head_impl,&old_text->value);
  }
  else {
    _Var2._M_head_impl = (Text *)0x0;
  }
  local_50._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
  super__Head_base<0UL,_Text_*,_false>._M_head_impl =
       (tuple<Text_*,_std::default_delete<Text>_>)
       (tuple<Text_*,_std::default_delete<Text>_>)_Var2._M_head_impl;
  if (new_text->is_some == true) {
    _Var2._M_head_impl = (Text *)operator_new(0x38);
    Text::Text(_Var2._M_head_impl,&new_text->value);
  }
  else {
    _Var2._M_head_impl = (Text *)0x0;
  }
  pNVar1 = local_48;
  local_40._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
  super__Head_base<0UL,_Text_*,_false>._M_head_impl =
       (tuple<Text_*,_std::default_delete<Text>_>)
       (tuple<Text_*,_std::default_delete<Text>_>)_Var2._M_head_impl;
  Node::Node(local_48,left,right,old_extent,new_extent,old_distance_from_left_ancestor,local_38,
             (unique_ptr<Text,_std::default_delete<Text>_> *)&local_50,
             (unique_ptr<Text,_std::default_delete<Text>_> *)&local_40,old_text_size);
  std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr
            ((unique_ptr<Text,_std::default_delete<Text>_> *)&local_40);
  std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr
            ((unique_ptr<Text,_std::default_delete<Text>_> *)&local_50);
  return pNVar1;
}

Assistant:

Patch::Node *Patch::build_node(Node *left, Node *right,
                       Point old_distance_from_left_ancestor,
                       Point new_distance_from_left_ancestor,
                       Point old_extent, Point new_extent,
                       optional<Text> &&old_text, optional<Text> &&new_text,
                       uint32_t old_text_size) {
  change_count++;
  return new Node{
    left,
    right,
    old_extent,
    new_extent,
    old_distance_from_left_ancestor,
    new_distance_from_left_ancestor,
    old_text ? unique_ptr<Text>{new Text(*old_text)} : nullptr,
    new_text ? unique_ptr<Text>{new Text(*new_text)} : nullptr,
    old_text_size
  };
}